

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcapimin.c
# Opt level: O1

void jpeg_suppress_tables(j_compress_ptr cinfo,boolean suppress)

{
  long lVar1;
  
  lVar1 = 0;
  do {
    if (cinfo->quant_tbl_ptrs[lVar1] != (JQUANT_TBL *)0x0) {
      cinfo->quant_tbl_ptrs[lVar1]->sent_table = suppress;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 4);
  lVar1 = -4;
  do {
    if (cinfo->ac_huff_tbl_ptrs[lVar1] != (JHUFF_TBL *)0x0) {
      cinfo->ac_huff_tbl_ptrs[lVar1]->sent_table = suppress;
    }
    if (*(long *)(cinfo->arith_dc_L + lVar1 * 8) != 0) {
      *(boolean *)(*(long *)(cinfo->arith_dc_L + lVar1 * 8) + 0x114) = suppress;
    }
    lVar1 = lVar1 + 1;
  } while (lVar1 != 0);
  return;
}

Assistant:

GLOBAL(void)
jpeg_suppress_tables (j_compress_ptr cinfo, boolean suppress)
{
  int i;
  JQUANT_TBL * qtbl;
  JHUFF_TBL * htbl;

  for (i = 0; i < NUM_QUANT_TBLS; i++) {
    if ((qtbl = cinfo->quant_tbl_ptrs[i]) != NULL)
      qtbl->sent_table = suppress;
  }

  for (i = 0; i < NUM_HUFF_TBLS; i++) {
    if ((htbl = cinfo->dc_huff_tbl_ptrs[i]) != NULL)
      htbl->sent_table = suppress;
    if ((htbl = cinfo->ac_huff_tbl_ptrs[i]) != NULL)
      htbl->sent_table = suppress;
  }
}